

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Matrix * MatrixLookAt(Matrix *__return_storage_ptr__,Vector3 eye,Vector3 target,Vector3 up)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar4 = eye.z;
  fVar2 = eye.x;
  fVar3 = eye.y;
  fVar8 = fVar4 - target.z;
  fVar11 = fVar2 - target.x;
  fVar13 = fVar3 - target.y;
  fVar5 = SQRT(fVar8 * fVar8 + fVar11 * fVar11 + fVar13 * fVar13);
  uVar1 = -(uint)(fVar5 == 0.0);
  fVar5 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar5));
  fVar11 = fVar5 * fVar11;
  fVar13 = fVar5 * fVar13;
  fVar5 = fVar5 * fVar8;
  fVar9 = up.y * fVar5 - fVar13 * up.z;
  fVar6 = up.z * fVar11 - fVar5 * up.x;
  fVar7 = up.x * fVar13 - fVar11 * up.y;
  fVar8 = SQRT(fVar7 * fVar7 + fVar9 * fVar9 + fVar6 * fVar6);
  uVar1 = -(uint)(fVar8 == 0.0);
  fVar8 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar8));
  fVar9 = fVar8 * fVar9;
  fVar6 = fVar8 * fVar6;
  fVar8 = fVar8 * fVar7;
  fVar7 = fVar13 * fVar8 - fVar5 * fVar6;
  fVar10 = fVar5 * fVar9 - fVar8 * fVar11;
  __return_storage_ptr__->m0 = fVar9;
  __return_storage_ptr__->m1 = fVar7;
  __return_storage_ptr__->m5 = fVar10;
  __return_storage_ptr__->m2 = fVar11;
  __return_storage_ptr__->m6 = fVar13;
  fVar12 = fVar11 * fVar6 - fVar9 * fVar13;
  __return_storage_ptr__->m4 = fVar6;
  __return_storage_ptr__->m8 = fVar8;
  __return_storage_ptr__->m9 = fVar12;
  __return_storage_ptr__->m10 = fVar5;
  __return_storage_ptr__->m12 = -(fVar8 * fVar4 + fVar9 * fVar2 + fVar6 * fVar3);
  __return_storage_ptr__->m13 = -(fVar12 * fVar4 + fVar7 * fVar2 + fVar10 * fVar3);
  __return_storage_ptr__->m14 = -(fVar5 * fVar4 + fVar11 * fVar2 + fVar13 * fVar3);
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixLookAt(Vector3 eye, Vector3 target, Vector3 up)
{
    Matrix result = { 0 };

    Vector3 z = Vector3Subtract(eye, target);
    z = Vector3Normalize(z);
    Vector3 x = Vector3CrossProduct(up, z);
    x = Vector3Normalize(x);
    Vector3 y = Vector3CrossProduct(z, x);

    result.m0 = x.x;
    result.m1 = y.x;
    result.m2 = z.x;
    result.m3 = 0.0f;
    result.m4 = x.y;
    result.m5 = y.y;
    result.m6 = z.y;
    result.m7 = 0.0f;
    result.m8 = x.z;
    result.m9 = y.z;
    result.m10 = z.z;
    result.m11 = 0.0f;
    result.m12 = -Vector3DotProduct(x, eye);
    result.m13 = -Vector3DotProduct(y, eye);
    result.m14 = -Vector3DotProduct(z, eye);
    result.m15 = 1.0f;

    return result;
}